

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cc
# Opt level: O2

TempFile * __thiscall
TempFile::Create(TempFile *__return_storage_ptr__,TempFile *this,string_view base_template)

{
  undefined1 __n [8];
  TempFile *pTVar1;
  bool bVar2;
  int __fd;
  char *pcVar3;
  size_t __n_00;
  FILE *f;
  undefined8 uVar4;
  char *pcVar5;
  ulong uVar6;
  ptrdiff_t _Num;
  ptrdiff_t _Num_1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string_view path;
  basic_string_view<char,_std::char_traits<char>_> __x;
  char *pcVar7;
  undefined1 local_70 [8];
  string_view base_template_local;
  size_t local_58;
  char local_50 [16];
  TempFile *local_40;
  _Head_base<0UL,_char_*,_false> local_38;
  unique_ptr<char[],_std::default_delete<char[]>_> path_template;
  
  base_template_local._M_len = base_template._M_len;
  local_70 = (undefined1  [8])this;
  local_40 = __return_storage_ptr__;
  __x = std::basic_string_view<char,_std::char_traits<char>_>::substr
                  ((basic_string_view<char,_std::char_traits<char>_> *)local_70,
                   (size_type)((long)&this[-1].path.field_2 + 10),0xffffffffffffffff);
  __y._M_str = "XXXXXX";
  __y._M_len = 6;
  bVar2 = std::operator==(__x,__y);
  if (bVar2) {
    pcVar3 = getenv("TMPDIR");
    pcVar5 = "/tmp";
    if (pcVar3 != (char *)0x0) {
      pcVar5 = pcVar3;
    }
    __n_00 = strlen(pcVar5);
    __n = local_70;
    uVar6 = (long)(FILE **)local_70 + __n_00 + 2;
    pcVar3 = (char *)operator_new__(uVar6);
    local_38._M_head_impl = pcVar3;
    if (__n_00 != 0) {
      memmove(pcVar3,pcVar5,__n_00);
    }
    pcVar5 = pcVar3 + __n_00 + 1;
    pcVar3[__n_00] = '/';
    if (__n != (undefined1  [8])0x0) {
      memmove(pcVar5,(void *)base_template_local._M_len,(size_t)__n);
    }
    pcVar5[(long)__n] = '\0';
    if (pcVar5 + (long)__n + 1 == pcVar3 + uVar6) {
      __fd = mkstemp(pcVar3);
      if (-1 < __fd) {
        f = fdopen(__fd,"r+");
        base_template_local._M_str = local_50;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&base_template_local._M_str,local_38._M_head_impl,
                   (char *)((long)(FILE **)__n + (long)(local_38._M_head_impl + __n_00 + 1)));
        pTVar1 = local_40;
        path._M_str = base_template_local._M_str;
        path._M_len = local_58;
        TempFile(local_40,(FILE *)f,path);
        std::__cxx11::string::~string((string *)&base_template_local._M_str);
        std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                  ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_38);
        return pTVar1;
      }
      perror("mkstemp");
      pcVar7 = "0";
      pcVar5 = "fd";
      pcVar3 = ">=";
      uVar4 = 0xa9;
    }
    else {
      pcVar7 = "path_template.get() + len";
      pcVar5 = "it";
      pcVar3 = "==";
      uVar4 = 0xa3;
    }
  }
  else {
    pcVar7 = "\"XXXXXX\"";
    pcVar5 = "base_template.substr(base_template.size() - 6)";
    pcVar3 = "==";
    uVar4 = 0x96;
  }
  fprintf(_stderr,"%s:%d Check failed: %s %s %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/sampling_test.cc"
          ,uVar4,pcVar5,pcVar3,pcVar7);
  abort();
}

Assistant:

static TempFile Create(std::string_view base_template) {
    CHECK_EQ(base_template.substr(base_template.size() - 6), "XXXXXX");

    const char* raw_tmpdir = getenv("TMPDIR");
    if (raw_tmpdir == nullptr) {
      raw_tmpdir = "/tmp";
    }
    std::string_view tmpdir{raw_tmpdir};
    size_t len = tmpdir.size() + 1 + base_template.size() + 1;
    std::unique_ptr<char[]> path_template{new char[len]};
    auto it = std::copy(tmpdir.begin(), tmpdir.end(), path_template.get());
    *it++ = '/';
    it = std::copy(base_template.begin(), base_template.end(), it);
    *it++ = '\0';
    CHECK_EQ(it, path_template.get() + len);

    int fd = mkstemp(path_template.get());
    if (fd < 0) {
      perror("mkstemp");
    }
    CHECK_GE(fd, 0);

    return TempFile{fdopen(fd, "r+"), std::string(path_template.get(), len-1)};
  }